

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

float __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,float,duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
          *accessor)

{
  DataChunk *pDVar1;
  idx_t iVar2;
  MadAccessor<float,_float,_float> *pMVar3;
  CURSOR *pCVar4;
  long lVar5;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>_>
  __comp_01;
  bool bVar6;
  ulong uVar7;
  reference pvVar8;
  idx_t iVar9;
  ulong uVar10;
  InvalidInputException *pIVar11;
  idx_t iVar12;
  duckdb *pdVar13;
  idx_t iVar14;
  float fVar15;
  float result_1;
  float local_7c;
  string local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_58._8_8_ = local_58._0_8_;
  bVar6 = this->desc;
  iVar12 = this->CRN;
  iVar14 = this->FRN;
  iVar2 = this->begin;
  iVar9 = this->end;
  local_78._M_dataplus._M_p = (pointer)accessor;
  local_78._M_string_length = (size_type)accessor;
  local_78.field_2._M_local_buf[0] = bVar6;
  if (iVar12 == iVar14) {
    if (iVar12 != iVar9 && iVar2 != iVar9) {
      uVar7 = (long)(iVar9 * 8 + iVar2 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar6;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>>>
                (v_t + iVar2,v_t + iVar12,v_t + iVar9,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp);
      iVar12 = this->FRN;
    }
    pMVar3 = accessor->outer;
    pCVar4 = accessor->inner->data;
    uVar7 = v_t[iVar12];
    if (((pCVar4->scan).next_row_index <= uVar7) ||
       (uVar10 = (pCVar4->scan).current_row_index, uVar7 < uVar10)) {
      pDVar1 = &pCVar4->page;
      ColumnDataCollection::Seek(pCVar4->inputs,uVar7,&pCVar4->scan,pDVar1);
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar4->data = (float *)pvVar8->data;
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar8);
      pCVar4->validity = &pvVar8->validity;
      uVar10 = (pCVar4->scan).current_row_index;
    }
    fVar15 = ABS(pCVar4->data[(uint)((int)uVar7 - (int)uVar10)] - *pMVar3->median);
    local_58 = ZEXT416((uint)fVar15);
    pdVar13 = (duckdb *)0x0;
    bVar6 = TryCast::Operation<float,float>(fVar15,&local_7c,false);
    if (!bVar6) {
      pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_78,pdVar13,(float)local_58._0_4_);
      InvalidInputException::InvalidInputException(pIVar11,&local_78);
      __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar14 != iVar9 && iVar2 != iVar9) {
      uVar7 = (long)(iVar9 * 8 + iVar2 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar6;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>>>
                (v_t + iVar2,v_t + iVar14,v_t + iVar9,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar14 = this->FRN;
      iVar12 = this->CRN;
      iVar9 = this->end;
    }
    local_78._M_dataplus._M_p = (pointer)accessor;
    local_78._M_string_length = (size_type)accessor;
    local_78.field_2._M_local_buf[0] = bVar6;
    if (iVar12 != iVar9 && iVar14 != iVar9) {
      uVar7 = (long)(iVar9 * 8 + iVar14 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar6;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,float,float>,duckdb::QuantileIndirect<float>>>>>
                (v_t + iVar14,v_t + iVar12,v_t + iVar9,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar14 = this->FRN;
    }
    local_58._0_8_ = accessor->outer;
    pCVar4 = accessor->inner->data;
    uVar7 = v_t[iVar14];
    if (((pCVar4->scan).next_row_index <= uVar7) ||
       (uVar10 = (pCVar4->scan).current_row_index, uVar7 < uVar10)) {
      pDVar1 = &pCVar4->page;
      ColumnDataCollection::Seek(pCVar4->inputs,uVar7,&pCVar4->scan,pDVar1);
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar4->data = (float *)pvVar8->data;
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar8);
      pCVar4->validity = &pvVar8->validity;
      uVar10 = (pCVar4->scan).current_row_index;
    }
    fVar15 = ABS(pCVar4->data[(uint)((int)uVar7 - (int)uVar10)] -
                 *((MadAccessor<float,_float,_float> *)local_58._0_8_)->median);
    local_58 = ZEXT416((uint)fVar15);
    pdVar13 = (duckdb *)0x0;
    bVar6 = TryCast::Operation<float,float>(fVar15,&local_7c,false);
    if (!bVar6) {
      pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_78,pdVar13,(float)local_58._0_4_);
      InvalidInputException::InvalidInputException(pIVar11,&local_78);
      __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_58._0_4_ = local_7c;
    pMVar3 = accessor->outer;
    pCVar4 = accessor->inner->data;
    uVar7 = v_t[this->CRN];
    uVar10 = (pCVar4->scan).current_row_index;
    if ((pCVar4->scan).next_row_index <= uVar7 || uVar7 < uVar10) {
      pDVar1 = &pCVar4->page;
      ColumnDataCollection::Seek(pCVar4->inputs,uVar7,&pCVar4->scan,pDVar1);
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar4->data = (float *)pvVar8->data;
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar8);
      pCVar4->validity = &pvVar8->validity;
      uVar10 = (pCVar4->scan).current_row_index;
    }
    fVar15 = ABS(pCVar4->data[(uint)((int)uVar7 - (int)uVar10)] - *pMVar3->median);
    local_48 = ZEXT416((uint)fVar15);
    pdVar13 = (duckdb *)0x0;
    bVar6 = TryCast::Operation<float,float>(fVar15,&local_7c,false);
    if (!bVar6) {
      pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_78,pdVar13,(float)local_48._0_4_);
      InvalidInputException::InvalidInputException(pIVar11,&local_78);
      __cxa_throw(pIVar11,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_7c = (float)((double)(local_7c - (float)local_58._0_4_) *
                       (this->RN -
                       (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                      (double)(float)local_58._0_4_);
  }
  return local_7c;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}